

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
vectors_difference(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                   *__return_storage_ptr__,
                  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v1,
                  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v2)

{
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  __sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  __set_difference<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::back_insert_iterator<std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

vector<mir::inst::VarId> vectors_difference(vector<mir::inst::VarId> v1,
                                            vector<mir::inst::VarId> v2) {
  vector<mir::inst::VarId> v;
  sort(v1.begin(), v1.end());
  sort(v2.begin(), v2.end());
  set_difference(v1.begin(), v1.end(), v2.begin(), v2.end(), back_inserter(v));
  return v;
}